

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O3

void learn(mf *data,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  uchar uVar2;
  uchar uVar3;
  uchar *puVar4;
  pointer pbVar5;
  float *pfVar6;
  ulong uVar7;
  features *pfVar8;
  int iVar9;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *i;
  uchar local_59;
  features *local_58;
  features *local_50;
  float local_44;
  pointer local_40;
  pointer local_38;
  
  predict<true>(data,base,ec);
  local_44 = (ec->pred).scalar;
  (**(code **)(base + 0x38))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  (ec->pred).scalar = ec->updated_prediction;
  v_array<unsigned_char>::clear(&data->indices);
  puVar4 = (ec->super_example_predict).indices._begin;
  push_many<unsigned_char>
            (&data->indices,puVar4,(long)(ec->super_example_predict).indices._end - (long)puVar4);
  v_array<unsigned_char>::clear((v_array<unsigned_char> *)ec);
  local_59 = '\0';
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,&local_59);
  pbVar5 = (data->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (data->pairs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != local_40) {
    local_58 = (ec->super_example_predict).feature_space;
    local_50 = &data->temp_features;
    do {
      puVar4 = (uchar *)(pbVar5->_M_dataplus)._M_p;
      uVar2 = *puVar4;
      local_38 = pbVar5;
      if (local_58[(char)uVar2].values._end != local_58[(char)uVar2].values._begin) {
        uVar3 = puVar4[1];
        if (local_58[(char)uVar3].values._end != local_58[(char)uVar3].values._begin) {
          pfVar8 = local_58 + (char)uVar2;
          *(ec->super_example_predict).indices._begin = uVar2;
          features::deep_copy_from(local_50,pfVar8);
          if (data->rank != 0) {
            uVar10 = 1;
            do {
              pfVar6 = (pfVar8->values)._begin;
              if ((pfVar8->values)._end != pfVar6) {
                uVar7 = 0;
                do {
                  pfVar6[uVar7] = (data->sub_predictions)._begin[uVar10 * 2] * pfVar6[uVar7];
                  uVar7 = uVar7 + 1;
                  pfVar6 = (pfVar8->values)._begin;
                } while (uVar7 < (ulong)((long)(pfVar8->values)._end - (long)pfVar6 >> 2));
              }
              puVar1 = &(ec->super_example_predict).ft_offset;
              *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar10);
              (**(code **)(base + 0x38))
                        (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
              puVar1 = &(ec->super_example_predict).ft_offset;
              *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar10);
              features::deep_copy_from(pfVar8,local_50);
              uVar10 = uVar10 + 1;
            } while (uVar10 <= data->rank);
          }
          pfVar8 = local_58 + (char)uVar3;
          *(ec->super_example_predict).indices._begin = uVar3;
          features::deep_copy_from(local_50,pfVar8);
          uVar10 = data->rank;
          if (uVar10 != 0) {
            uVar7 = 1;
            do {
              iVar9 = (int)uVar10;
              pfVar6 = (pfVar8->values)._begin;
              if ((pfVar8->values)._end != pfVar6) {
                uVar10 = 0;
                do {
                  pfVar6[uVar10] = (data->sub_predictions)._begin[uVar7 * 2 + -1] * pfVar6[uVar10];
                  uVar10 = uVar10 + 1;
                  pfVar6 = (pfVar8->values)._begin;
                } while (uVar10 < (ulong)((long)(pfVar8->values)._end - (long)pfVar6 >> 2));
                iVar9 = (int)data->rank;
              }
              iVar9 = iVar9 + (int)uVar7;
              puVar1 = &(ec->super_example_predict).ft_offset;
              *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar9);
              (**(code **)(base + 0x38))
                        (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
              puVar1 = &(ec->super_example_predict).ft_offset;
              *puVar1 = *puVar1 - (ulong)(uint)(iVar9 * *(int *)(base + 0xe0));
              (ec->pred).scalar = ec->updated_prediction;
              features::deep_copy_from(pfVar8,local_50);
              uVar7 = uVar7 + 1;
              uVar10 = data->rank;
            } while (uVar7 <= uVar10);
          }
        }
      }
      pbVar5 = local_38 + 1;
    } while (pbVar5 != local_40);
  }
  v_array<unsigned_char>::clear((v_array<unsigned_char> *)ec);
  puVar4 = (data->indices)._begin;
  push_many<unsigned_char>
            ((v_array<unsigned_char> *)ec,puVar4,(long)(data->indices)._end - (long)puVar4);
  (ec->pred).scalar = local_44;
  return;
}

Assistant:

void learn(mf& data, single_learner& base, example& ec)
{
  // predict with current weights
  predict<true>(data, base, ec);
  float predicted = ec.pred.scalar;

  // update linear weights
  base.update(ec);
  ec.pred.scalar = ec.updated_prediction;

  // store namespace indices
  copy_array(data.indices, ec.indices);

  // erase indices
  ec.indices.clear();
  ec.indices.push_back(0);

  // update interaction terms
  // looping over all pairs of non-empty namespaces
  for (string& i : data.pairs)
  {
    int left_ns = (int)i[0];
    int right_ns = (int)i[1];

    if (ec.feature_space[left_ns].size() > 0 && ec.feature_space[right_ns].size() > 0)
    {
      // set example to left namespace only
      ec.indices[0] = left_ns;

      // store feature values in left namespace
      data.temp_features.deep_copy_from(ec.feature_space[left_ns]);

      for (size_t k = 1; k <= data.rank; k++)
      {
        features& fs = ec.feature_space[left_ns];
        // multiply features in left namespace by r^k * x_r
        for (size_t i = 0; i < fs.size(); ++i) fs.values[i] *= data.sub_predictions[2 * k];

        // update l^k using base learner
        base.update(ec, k);

        // restore left namespace features (undoing multiply)
        fs.deep_copy_from(data.temp_features);

        // compute new l_k * x_l scaling factors
        // base.predict(ec, k);
        // data.sub_predictions[2*k-1] = ec.partial_prediction;
        // ec.pred.scalar = ec.updated_prediction;
      }

      // set example to right namespace only
      ec.indices[0] = right_ns;

      // store feature values for right namespace
      data.temp_features.deep_copy_from(ec.feature_space[right_ns]);

      for (size_t k = 1; k <= data.rank; k++)
      {
        features& fs = ec.feature_space[right_ns];
        // multiply features in right namespace by l^k * x_l
        for (size_t i = 0; i < fs.size(); ++i) fs.values[i] *= data.sub_predictions[2 * k - 1];

        // update r^k using base learner
        base.update(ec, k + data.rank);
        ec.pred.scalar = ec.updated_prediction;

        // restore right namespace features
        fs.deep_copy_from(data.temp_features);
      }
    }
  }
  // restore namespace indices
  copy_array(ec.indices, data.indices);

  // restore original prediction
  ec.pred.scalar = predicted;
}